

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20240722::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness(google::protobuf::EnumDescriptorProto_const&,google::protobuf::EnumDescriptor_const*)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  undefined8 uVar1;
  pointer prVar2;
  undefined8 local_30;
  code *local_28;
  intptr_t local_20;
  code *local_18;
  
  uVar1 = *(undefined8 *)(**(long **)this + 8);
  prVar2 = lts_20240722::container_internal::
           raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
           ::iterator::operator->(*(iterator **)(this + 8));
  local_20 = (prVar2->second->super_Message).super_MessageLite._internal_metadata_.ptr_;
  local_28 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
  local_18 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
  local_30 = uVar1;
  absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
            (__return_storage_ptr__,
             "Enum name %s has the same name as %s if you ignore case and strip out the enum name prefix (if any). (If you are using allow_alias, please assign the same number to each enum value name.)"
             ,0xbb,&local_30,2);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}